

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_periodChecking_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_periodChecking_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_periodChecking_Test *this_00;
  TEST_MemoryLeakDetectorTest_periodChecking_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_periodChecking_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x1d7);
  TEST_MemoryLeakDetectorTest_periodChecking_Test::TEST_MemoryLeakDetectorTest_periodChecking_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodChecking)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}